

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O2

int stream_read(int hdl,void *buffer,long nbytes)

{
  int iVar1;
  size_t sVar2;
  
  if (hdl == 1) {
    sVar2 = fread(buffer,1,nbytes,_stdin);
    iVar1 = 0x6b;
    if (sVar2 == nbytes) {
      iVar1 = 0;
    }
    return iVar1;
  }
  return 1;
}

Assistant:

int stream_read(int hdl, void *buffer, long nbytes)
/*
     reading from stdin stream 
*/

{
    long nread;
    
    if (hdl != 1)
       return(1);  /* can only read from stdin */

    nread = (long) fread(buffer, 1, nbytes, stdin);

    if (nread != nbytes)
    {
/*        return(READ_ERROR); */
        return(END_OF_FILE);
    }

    return(0);
}